

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

bool __thiscall MapLoader::fileIsValid(MapLoader *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  istream *piVar4;
  ostream *poVar5;
  long *plVar6;
  int iVar7;
  string line;
  string mapExt;
  ifstream input;
  ofstream output;
  int local_47c;
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long local_438 [4];
  byte abStack_418 [488];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,".map","");
  lVar3 = std::__cxx11::string::find((char *)&this->filePath,(ulong)local_458[0],0);
  if (lVar3 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The file requested does not contain a .map extension.",0x35);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  else {
    std::ofstream::ofstream(&local_230);
    std::ifstream::ifstream(local_438);
    std::ifstream::open((string *)local_438,(_Ios_Openmode)&this->filePath);
    if ((abStack_418[*(long *)(local_438[0] + -0x18)] & 5) == 0) {
      local_478[0] = local_468;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"");
      local_47c = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + 1;
        do {
          iVar2 = iVar7;
          piVar4 = std::operator>>((istream *)local_438,(string *)local_478);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Number of nodes ",0x10);
            plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_47c);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            if (local_47c == 0) {
              std::ifstream::close();
            }
            else {
              std::ifstream::close();
              this->nodeCount = local_47c;
            }
            if (local_478[0] != local_468) {
              operator_delete(local_478[0],local_468[0] + 1);
            }
            std::ifstream::~ifstream(local_438);
            local_230 = _VTT;
            *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
            std::filebuf::~filebuf(local_228);
            std::ios_base::~ios_base(local_138);
            if (local_458[0] != local_448) {
              operator_delete(local_458[0],local_448[0] + 1);
            }
            return local_47c != 0;
          }
          iVar1 = std::__cxx11::string::compare((char *)local_478);
          iVar7 = iVar2 + 1;
        } while (iVar1 != 0);
        std::operator>>((istream *)local_438,(string *)local_478);
        iVar1 = std::__cxx11::string::compare((char *)local_478);
        if (iVar1 != 0) {
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Missing opening brace in file ",0x1e);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(this->filePath)._M_dataplus._M_p,
                              (this->filePath)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," near line ",0xb);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_001167e6;
        }
        std::operator>>((istream *)local_438,(string *)local_478);
        iVar1 = std::__cxx11::string::compare((char *)local_478);
        if (iVar1 != 0) {
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Missing node name field in file ",0x20);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(this->filePath)._M_dataplus._M_p,
                              (this->filePath)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," near line ",0xb);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2 + 2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_001167e6;
        }
        while( true ) {
          iVar2 = std::__cxx11::string::compare((char *)local_478);
          if (iVar2 == 0) break;
          iVar2 = std::__cxx11::string::compare((char *)local_478);
          if (iVar2 == 0) break;
          iVar2 = std::__cxx11::string::compare((char *)local_478);
          if (iVar2 == 0) break;
          std::operator>>((istream *)local_438,(string *)local_478);
          iVar7 = iVar7 + 1;
        }
        iVar2 = std::__cxx11::string::compare((char *)local_478);
        if (iVar2 != 0) {
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Missing type field in file ",0x1b);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(this->filePath)._M_dataplus._M_p,
                              (this->filePath)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," near line ",0xb);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar7 + 1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_001167e6;
        }
        std::operator>>((istream *)local_438,(string *)local_478);
        iVar7 = iVar7 + 2;
        iVar2 = std::__cxx11::string::compare((char *)local_478);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)local_478);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)local_478);
            if (iVar2 != 0) {
              std::ifstream::close();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Invalid type field in file ",0x1b);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(this->filePath)._M_dataplus._M_p,
                                  (this->filePath)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," near line ",0xb);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
              std::endl<char,std::char_traits<char>>(poVar5);
              goto LAB_001167e6;
            }
          }
        }
        local_47c = local_47c + 1;
        iVar2 = 0;
        while( true ) {
          piVar4 = std::operator>>((istream *)local_438,(string *)local_478);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
          iVar1 = std::__cxx11::string::compare((char *)local_478);
          if (iVar1 == 0) break;
          iVar7 = iVar7 + 1;
          iVar1 = std::__cxx11::string::compare((char *)local_478);
          iVar2 = iVar2 + (uint)(iVar1 == 0);
        }
        if (iVar2 == 0) {
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"No adjacent nodes found in ",0x1b);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(this->filePath)._M_dataplus._M_p,
                              (this->filePath)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," near line ",0xb);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_001167e6;
        }
        iVar2 = std::__cxx11::string::compare((char *)local_478);
      } while (iVar2 == 0);
      std::ifstream::close();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Missing closing brace in file ",0x1e);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->filePath)._M_dataplus._M_p,
                          (this->filePath)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," near line ",0xb);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      std::ifstream::close();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"The file at ",0xc);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->filePath)._M_dataplus._M_p,
                          (this->filePath)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," could not be opened.",0x15);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
LAB_001167e6:
  exit(0);
}

Assistant:

bool MapLoader::fileIsValid()
{
  //method to check if the file is valid

  //before doing anything, check if the file path contains a .map extension
  string mapExt = ".map";

  if(filePath.find(mapExt) == string::npos)
  {
    cerr << "The file requested does not contain a .map extension." << endl;
    exit(0);
    return false;
  }


  //first we will attempt to open the file
  ofstream output;
  ifstream input; //the input stream associated to out file
  input.open(filePath); //try opening the file


  if(!input)
  {
    //if the input file could not be opened, then that means that the input file is not valid
    //therefore close the stream and return false
    input.close();
    cerr << "The file at " << filePath << " could not be opened." << endl;
    exit(0);
    return false;
  }

  //if we passed this point, it means that the file is open

  //we need to check each node to make sure that it is correctly formed
  int numbOfNodes = 0; //the count of the number of nodes in the file
  int lineNumber = 0; //the line we are at

  //now we need to count the number of times the word "@node" is contained in the file
  string line = ""; //the current line being read
  while(input >> line) //while the input stream still has lines to read keep reading
  {
    lineNumber++;

    if(line == "@node") //if the line is equal to "@node", this is the inclusion of another node
    {
      numbOfNodes++;
      //now we know that we are at the beginning of a node declaration
      //check the next line to see if it is a "{"
      input >> line;
      lineNumber++;
      if(line != "{")
      {
        input.close();
        cout << "Missing opening brace in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //then check if the line after that contains a name field
      input >> line;
      lineNumber++;
      if(line != "name:")
      {
        input.close();
        cout << "Missing node name field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false; //if the next line does not contain a name field then we return false
      }

      //then check if the line after that contains a type field
      while(line != "type:" && !(line == "adjacent:" || line == "}"))
      {
        input >> line;
        lineNumber++;
      }

      if(line != "type:")
      {
        input.close();
        cout << "Missing type field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //then check that the type is valid
      input >> line;
      lineNumber++;
      if(!(line == "master" || line == "inner" || line == "outer"))
      {
        input.close();
        cout << "Invalid type field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
      }

      //now we need to make sure that the node has at least one adjacent node to make sure that the graph will be a connected graph
      int adjacentCount = 0;
      while(input >> line && line != "}")
      {
        lineNumber++;
        if(line == "adjacent:")
        {
          adjacentCount ++;
        }
      }

      //if by the end of the loop the adjacent count is still zero, then the file is not valid
      if(adjacentCount == 0)
      {
        input.close();
        cout << "No adjacent nodes found in " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //now that we have reached the last adjacent node, check if the current line contains a "}"
      if(line != "}")
      {
        input.close();
        cout << "Missing closing brace in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

    }

  }

  //if we made it to this point without returning, then that means the file is valid and we return true
  //as long as there is more than one node

  cout << "Number of nodes " << numbOfNodes << endl;
  if(numbOfNodes > 0)
  {
    input.close();
    nodeCount = numbOfNodes;
    return true;
  }

  //if there was not more than one node, then return false;
  input.close();
  return false;

}